

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Segment::AppendCluster(Segment *this,Cluster *pCluster)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Cluster **ppCVar5;
  long lVar6;
  Cluster **ppCVar7;
  int iVar8;
  ulong uVar9;
  
  if ((pCluster != (Cluster *)0x0) && (lVar1 = pCluster->m_index, -1 < lVar1)) {
    lVar2 = this->m_clusterCount;
    lVar3 = this->m_clusterPreloadCount;
    lVar6 = lVar3 + lVar2;
    lVar4 = this->m_clusterSize;
    if (lVar1 == lVar2 && lVar6 <= lVar4) {
      if (lVar4 <= lVar6) {
        uVar9 = 0x800;
        if (0 < lVar4) {
          uVar9 = lVar4 * 2;
        }
        ppCVar5 = (Cluster **)
                  operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8,(nothrow_t *)&std::nothrow
                                );
        if (ppCVar5 == (Cluster **)0x0) {
          return false;
        }
        ppCVar7 = this->m_clusters;
        if (lVar6 != 0) {
          lVar6 = 0;
          do {
            *(undefined8 *)((long)ppCVar5 + lVar6) = *(undefined8 *)((long)ppCVar7 + lVar6);
            lVar6 = lVar6 + 8;
          } while (lVar3 * 8 + lVar2 * 8 != lVar6);
        }
        if (ppCVar7 != (Cluster **)0x0) {
          operator_delete__(ppCVar7);
        }
        this->m_clusters = ppCVar5;
        this->m_clusterSize = uVar9;
      }
      if (this->m_clusterPreloadCount < 1) {
LAB_00156975:
        this->m_clusters[lVar1] = pCluster;
        this->m_clusterCount = this->m_clusterCount + 1;
        return true;
      }
      ppCVar5 = this->m_clusters;
      lVar6 = this->m_clusterCount;
      if (ppCVar5[lVar6] != (Cluster *)0x0) {
        if (-1 < ppCVar5[lVar6]->m_index) {
          return false;
        }
        ppCVar7 = ppCVar5 + lVar6 + this->m_clusterPreloadCount;
        if (ppCVar5 + this->m_clusterSize <= ppCVar7) {
          return false;
        }
        do {
          iVar8 = 1;
          if (ppCVar7[-1]->m_index < 0) {
            *ppCVar7 = ppCVar7[-1];
            ppCVar7 = ppCVar7 + -1;
            iVar8 = (uint)(ppCVar7 == ppCVar5 + lVar6) << 2;
          }
        } while (iVar8 == 0);
        if (iVar8 == 4) goto LAB_00156975;
      }
    }
  }
  return false;
}

Assistant:

bool Segment::AppendCluster(Cluster* pCluster) {
  if (pCluster == NULL || pCluster->m_index < 0)
    return false;

  const long count = m_clusterCount + m_clusterPreloadCount;

  long& size = m_clusterSize;
  const long idx = pCluster->m_index;

  if (size < count || idx != m_clusterCount)
    return false;

  if (count >= size) {
    const long n = (size <= 0) ? 2048 : 2 * size;

    Cluster** const qq = new (std::nothrow) Cluster*[n];
    if (qq == NULL)
      return false;

    Cluster** q = qq;
    Cluster** p = m_clusters;
    Cluster** const pp = p + count;

    while (p != pp)
      *q++ = *p++;

    delete[] m_clusters;

    m_clusters = qq;
    size = n;
  }

  if (m_clusterPreloadCount > 0) {
    Cluster** const p = m_clusters + m_clusterCount;
    if (*p == NULL || (*p)->m_index >= 0)
      return false;

    Cluster** q = p + m_clusterPreloadCount;
    if (q >= (m_clusters + size))
      return false;

    for (;;) {
      Cluster** const qq = q - 1;
      if ((*qq)->m_index >= 0)
        return false;

      *q = *qq;
      q = qq;

      if (q == p)
        break;
    }
  }

  m_clusters[idx] = pCluster;
  ++m_clusterCount;
  return true;
}